

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<std::vector<bool,std::allocator<bool>>,void>
               (vector<bool,_std::allocator<bool>_> *container,ostream *os)

{
  uint uVar1;
  ulong uVar2;
  char8_t *pcVar3;
  ulong *puVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  char local_3d [5];
  ulong *local_38;
  
  local_3d[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 2,1);
  puVar4 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  local_38 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (container->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if (puVar4 != local_38 || uVar1 != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      uVar2 = *puVar4;
      if (lVar6 == 0) {
LAB_001d1f2b:
        local_3d[1] = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 1,1);
        bVar7 = (1L << ((byte)uVar5 & 0x3f) & uVar2) == 0;
        pcVar3 = "some_true";
        if (bVar7) {
          pcVar3 = "some_false";
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3 + 5,(ulong)bVar7 | 4);
        lVar6 = lVar6 + 1;
        bVar7 = true;
      }
      else {
        local_3d[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,local_3d,1);
        if (lVar6 != 0x20) goto LAB_001d1f2b;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar6 = 0x20;
        bVar7 = false;
      }
      if (!bVar7) break;
      bVar7 = uVar5 == 0x3f;
      uVar5 = uVar5 + 1;
      if (bVar7) {
        uVar5 = 0;
      }
      puVar4 = puVar4 + bVar7;
    } while (uVar5 != uVar1 || puVar4 != local_38);
    if (lVar6 != 0) {
      local_3d[3] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 3,1);
    }
  }
  local_3d[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3d + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }